

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

MIR_insn_code_t get_mir_type_insn_code(c2m_ctx_t c2m_ctx,type *type,node_t_conflict r)

{
  MIR_type_t MVar1;
  MIR_insn_code_t local_100;
  MIR_insn_code_t local_fc;
  MIR_insn_code_t local_f8;
  MIR_insn_code_t local_f4;
  MIR_insn_code_t local_f0;
  MIR_insn_code_t local_ec;
  MIR_insn_code_t local_e8;
  MIR_insn_code_t local_e4;
  MIR_insn_code_t local_e0;
  MIR_insn_code_t local_dc;
  MIR_insn_code_t local_d8;
  MIR_insn_code_t local_d4;
  MIR_insn_code_t local_d0;
  MIR_insn_code_t local_cc;
  MIR_insn_code_t local_c8;
  MIR_insn_code_t local_c4;
  MIR_insn_code_t local_c0;
  MIR_insn_code_t local_bc;
  MIR_insn_code_t local_b8;
  MIR_insn_code_t local_b4;
  MIR_insn_code_t local_ac;
  MIR_insn_code_t local_a8;
  MIR_insn_code_t local_a4;
  MIR_insn_code_t local_9c;
  MIR_insn_code_t local_98;
  MIR_insn_code_t local_94;
  MIR_insn_code_t local_90;
  MIR_insn_code_t local_8c;
  MIR_insn_code_t local_84;
  MIR_insn_code_t local_80;
  MIR_insn_code_t local_7c;
  MIR_insn_code_t local_78;
  MIR_insn_code_t local_74;
  MIR_insn_code_t local_70;
  MIR_insn_code_t local_6c;
  MIR_insn_code_t local_64;
  MIR_insn_code_t local_60;
  MIR_insn_code_t local_5c;
  MIR_insn_code_t local_54;
  MIR_insn_code_t local_50;
  MIR_insn_code_t local_4c;
  MIR_insn_code_t local_44;
  MIR_insn_code_t local_40;
  MIR_insn_code_t local_3c;
  MIR_type_t t;
  node_t_conflict r_local;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  MVar1 = get_mir_type(c2m_ctx,type);
  switch(r->code) {
  case N_EQ:
    if (MVar1 == MIR_T_F) {
      local_94 = MIR_FEQ;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_98 = MIR_DEQ;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_9c = MIR_LDEQ;
        }
        else {
          local_9c = MIR_EQS;
          if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
            local_9c = MIR_EQ;
          }
        }
        local_98 = local_9c;
      }
      local_94 = local_98;
    }
    c2m_ctx_local._4_4_ = local_94;
    break;
  case N_NE:
    if (MVar1 == MIR_T_F) {
      local_a4 = MIR_FNE;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_a8 = MIR_DNE;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_ac = MIR_LDNE;
        }
        else {
          local_ac = MIR_NES;
          if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
            local_ac = MIR_NE;
          }
        }
        local_a8 = local_ac;
      }
      local_a4 = local_a8;
    }
    c2m_ctx_local._4_4_ = local_a4;
    break;
  case N_LT:
    if (MVar1 == MIR_T_F) {
      local_b4 = MIR_FLT;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_b8 = MIR_DLT;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_bc = MIR_LDLT;
        }
        else {
          if (MVar1 == MIR_T_I64) {
            local_c0 = MIR_LT;
          }
          else {
            if (MVar1 == MIR_T_U64) {
              local_c4 = MIR_ULT;
            }
            else {
              local_c4 = MIR_ULTS;
              if (MVar1 == MIR_T_I32) {
                local_c4 = MIR_LTS;
              }
            }
            local_c0 = local_c4;
          }
          local_bc = local_c0;
        }
        local_b8 = local_bc;
      }
      local_b4 = local_b8;
    }
    c2m_ctx_local._4_4_ = local_b4;
    break;
  case N_LE:
    if (MVar1 == MIR_T_F) {
      local_c8 = MIR_FLE;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_cc = MIR_DLE;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_d0 = MIR_LDLE;
        }
        else {
          if (MVar1 == MIR_T_I64) {
            local_d4 = MIR_LE;
          }
          else {
            if (MVar1 == MIR_T_U64) {
              local_d8 = MIR_ULE;
            }
            else {
              local_d8 = MIR_ULES;
              if (MVar1 == MIR_T_I32) {
                local_d8 = MIR_LES;
              }
            }
            local_d4 = local_d8;
          }
          local_d0 = local_d4;
        }
        local_cc = local_d0;
      }
      local_c8 = local_cc;
    }
    c2m_ctx_local._4_4_ = local_c8;
    break;
  case N_GT:
    if (MVar1 == MIR_T_F) {
      local_dc = MIR_FGT;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_e0 = MIR_DGT;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_e4 = MIR_LDGT;
        }
        else {
          if (MVar1 == MIR_T_I64) {
            local_e8 = MIR_GT;
          }
          else {
            if (MVar1 == MIR_T_U64) {
              local_ec = MIR_UGT;
            }
            else {
              local_ec = MIR_UGTS;
              if (MVar1 == MIR_T_I32) {
                local_ec = MIR_GTS;
              }
            }
            local_e8 = local_ec;
          }
          local_e4 = local_e8;
        }
        local_e0 = local_e4;
      }
      local_dc = local_e0;
    }
    c2m_ctx_local._4_4_ = local_dc;
    break;
  case N_GE:
    if (MVar1 == MIR_T_F) {
      local_f0 = MIR_FGE;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_f4 = MIR_DGE;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_f8 = MIR_LDGE;
        }
        else {
          if (MVar1 == MIR_T_I64) {
            local_fc = MIR_GE;
          }
          else {
            if (MVar1 == MIR_T_U64) {
              local_100 = MIR_UGE;
            }
            else {
              local_100 = MIR_UGES;
              if (MVar1 == MIR_T_I32) {
                local_100 = MIR_GES;
              }
            }
            local_fc = local_100;
          }
          local_f8 = local_fc;
        }
        local_f4 = local_f8;
      }
      local_f0 = local_f4;
    }
    c2m_ctx_local._4_4_ = local_f0;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2ac0,"MIR_insn_code_t get_mir_type_insn_code(c2m_ctx_t, struct type *, node_t)"
                 );
  case N_AND:
  case N_AND_ASSIGN:
    c2m_ctx_local._4_4_ = MIR_ANDS;
    if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
      c2m_ctx_local._4_4_ = MIR_AND;
    }
    break;
  case N_OR:
  case N_OR_ASSIGN:
    c2m_ctx_local._4_4_ = MIR_ORS;
    if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
      c2m_ctx_local._4_4_ = MIR_OR;
    }
    break;
  case N_XOR:
  case N_XOR_ASSIGN:
    c2m_ctx_local._4_4_ = MIR_XORS;
    if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
      c2m_ctx_local._4_4_ = MIR_XOR;
    }
    break;
  case N_LSH:
  case N_LSH_ASSIGN:
    c2m_ctx_local._4_4_ = MIR_LSHS;
    if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
      c2m_ctx_local._4_4_ = MIR_LSH;
    }
    break;
  case N_RSH:
  case N_RSH_ASSIGN:
    if (MVar1 == MIR_T_I64) {
      local_8c = MIR_RSH;
    }
    else {
      if (MVar1 == MIR_T_U64) {
        local_90 = MIR_URSH;
      }
      else {
        local_90 = MIR_URSHS;
        if (MVar1 == MIR_T_I32) {
          local_90 = MIR_RSHS;
        }
      }
      local_8c = local_90;
    }
    c2m_ctx_local._4_4_ = local_8c;
    break;
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_INC:
  case N_POST_INC:
    if (MVar1 == MIR_T_F) {
      local_3c = MIR_FADD;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_40 = MIR_DADD;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_44 = MIR_LDADD;
        }
        else {
          local_44 = MIR_ADDS;
          if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
            local_44 = MIR_ADD;
          }
        }
        local_40 = local_44;
      }
      local_3c = local_40;
    }
    c2m_ctx_local._4_4_ = local_3c;
    break;
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_DEC:
  case N_POST_DEC:
    if (MVar1 == MIR_T_F) {
      local_4c = MIR_FSUB;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_50 = MIR_DSUB;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_54 = MIR_LDSUB;
        }
        else {
          local_54 = MIR_SUBS;
          if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
            local_54 = MIR_SUB;
          }
        }
        local_50 = local_54;
      }
      local_4c = local_50;
    }
    c2m_ctx_local._4_4_ = local_4c;
    break;
  case N_MUL:
  case N_MUL_ASSIGN:
    if (MVar1 == MIR_T_F) {
      local_5c = MIR_FMUL;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_60 = MIR_DMUL;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_64 = MIR_LDMUL;
        }
        else {
          local_64 = MIR_MULS;
          if (MVar1 == MIR_T_I64 || MVar1 == MIR_T_U64) {
            local_64 = MIR_MUL;
          }
        }
        local_60 = local_64;
      }
      local_5c = local_60;
    }
    c2m_ctx_local._4_4_ = local_5c;
    break;
  case N_DIV:
  case N_DIV_ASSIGN:
    if (MVar1 == MIR_T_F) {
      local_6c = MIR_FDIV;
    }
    else {
      if (MVar1 == MIR_T_D) {
        local_70 = MIR_DDIV;
      }
      else {
        if (MVar1 == MIR_T_LD) {
          local_74 = MIR_LDDIV;
        }
        else {
          if (MVar1 == MIR_T_I64) {
            local_78 = MIR_DIV;
          }
          else {
            if (MVar1 == MIR_T_U64) {
              local_7c = MIR_UDIV;
            }
            else {
              local_7c = MIR_UDIVS;
              if (MVar1 == MIR_T_I32) {
                local_7c = MIR_DIVS;
              }
            }
            local_78 = local_7c;
          }
          local_74 = local_78;
        }
        local_70 = local_74;
      }
      local_6c = local_70;
    }
    c2m_ctx_local._4_4_ = local_6c;
    break;
  case N_MOD:
  case N_MOD_ASSIGN:
    if (MVar1 == MIR_T_I64) {
      local_80 = MIR_MOD;
    }
    else {
      if (MVar1 == MIR_T_U64) {
        local_84 = MIR_UMOD;
      }
      else {
        local_84 = MIR_UMODS;
        if (MVar1 == MIR_T_I32) {
          local_84 = MIR_MODS;
        }
      }
      local_80 = local_84;
    }
    c2m_ctx_local._4_4_ = local_80;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static MIR_insn_code_t get_mir_type_insn_code (c2m_ctx_t c2m_ctx, struct type *type, node_t r) {
  MIR_type_t t = get_mir_type (c2m_ctx, type);

  switch (r->code) {
  case N_INC:
  case N_POST_INC:
  case N_ADD:
  case N_ADD_ASSIGN:
    return (t == MIR_T_F                       ? MIR_FADD
            : t == MIR_T_D                     ? MIR_DADD
            : t == MIR_T_LD                    ? MIR_LDADD
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_ADD
                                               : MIR_ADDS);
  case N_DEC:
  case N_POST_DEC:
  case N_SUB:
  case N_SUB_ASSIGN:
    return (t == MIR_T_F                       ? MIR_FSUB
            : t == MIR_T_D                     ? MIR_DSUB
            : t == MIR_T_LD                    ? MIR_LDSUB
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_SUB
                                               : MIR_SUBS);
  case N_MUL:
  case N_MUL_ASSIGN:
    return (t == MIR_T_F                       ? MIR_FMUL
            : t == MIR_T_D                     ? MIR_DMUL
            : t == MIR_T_LD                    ? MIR_LDMUL
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_MUL
                                               : MIR_MULS);
  case N_DIV:
  case N_DIV_ASSIGN:
    return (t == MIR_T_F     ? MIR_FDIV
            : t == MIR_T_D   ? MIR_DDIV
            : t == MIR_T_LD  ? MIR_LDDIV
            : t == MIR_T_I64 ? MIR_DIV
            : t == MIR_T_U64 ? MIR_UDIV
            : t == MIR_T_I32 ? MIR_DIVS
                             : MIR_UDIVS);
  case N_MOD:
  case N_MOD_ASSIGN:
    return (t == MIR_T_I64   ? MIR_MOD
            : t == MIR_T_U64 ? MIR_UMOD
            : t == MIR_T_I32 ? MIR_MODS
                             : MIR_UMODS);
  case N_AND:
  case N_AND_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_AND : MIR_ANDS);
  case N_OR:
  case N_OR_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_OR : MIR_ORS);
  case N_XOR:
  case N_XOR_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_XOR : MIR_XORS);
  case N_LSH:
  case N_LSH_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_LSH : MIR_LSHS);
  case N_RSH:
  case N_RSH_ASSIGN:
    return (t == MIR_T_I64   ? MIR_RSH
            : t == MIR_T_U64 ? MIR_URSH
            : t == MIR_T_I32 ? MIR_RSHS
                             : MIR_URSHS);
  case N_EQ:
    return (t == MIR_T_F                       ? MIR_FEQ
            : t == MIR_T_D                     ? MIR_DEQ
            : t == MIR_T_LD                    ? MIR_LDEQ
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_EQ
                                               : MIR_EQS);
  case N_NE:
    return (t == MIR_T_F                       ? MIR_FNE
            : t == MIR_T_D                     ? MIR_DNE
            : t == MIR_T_LD                    ? MIR_LDNE
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_NE
                                               : MIR_NES);
  case N_LT:
    return (t == MIR_T_F     ? MIR_FLT
            : t == MIR_T_D   ? MIR_DLT
            : t == MIR_T_LD  ? MIR_LDLT
            : t == MIR_T_I64 ? MIR_LT
            : t == MIR_T_U64 ? MIR_ULT
            : t == MIR_T_I32 ? MIR_LTS
                             : MIR_ULTS);
  case N_LE:
    return (t == MIR_T_F     ? MIR_FLE
            : t == MIR_T_D   ? MIR_DLE
            : t == MIR_T_LD  ? MIR_LDLE
            : t == MIR_T_I64 ? MIR_LE
            : t == MIR_T_U64 ? MIR_ULE
            : t == MIR_T_I32 ? MIR_LES
                             : MIR_ULES);
  case N_GT:
    return (t == MIR_T_F     ? MIR_FGT
            : t == MIR_T_D   ? MIR_DGT
            : t == MIR_T_LD  ? MIR_LDGT
            : t == MIR_T_I64 ? MIR_GT
            : t == MIR_T_U64 ? MIR_UGT
            : t == MIR_T_I32 ? MIR_GTS
                             : MIR_UGTS);
  case N_GE:
    return (t == MIR_T_F     ? MIR_FGE
            : t == MIR_T_D   ? MIR_DGE
            : t == MIR_T_LD  ? MIR_LDGE
            : t == MIR_T_I64 ? MIR_GE
            : t == MIR_T_U64 ? MIR_UGE
            : t == MIR_T_I32 ? MIR_GES
                             : MIR_UGES);
  default: assert (FALSE); return MIR_INSN_BOUND;
  }
}